

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O2

bool Am_Point_In_All_Owners(Am_Object *in_obj,int x,int y,Am_Object *ref_obj)

{
  bool bVar1;
  bool bVar2;
  Am_Object owner;
  Am_Object result;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  uint local_3c;
  Am_Object local_38;
  
  local_60.data = (Am_Object_Data *)0x0;
  local_48.data = (Am_Object_Data *)0x0;
  local_3c = y;
  Am_Object::Am_Object(&local_50,&Am_Screen);
  bVar1 = Am_Object::Is_Instance_Of(in_obj,&local_50);
  Am_Object::~Am_Object(&local_50);
  bVar2 = true;
  if (!bVar1) {
    Am_Object::Am_Object(&local_58,ref_obj);
    bVar1 = Am_Object::Is_Part_Of(in_obj,&local_58);
    Am_Object::~Am_Object(&local_58);
    if (bVar1) {
      bVar1 = Am_Object::operator==(in_obj,ref_obj);
      if (!bVar1) {
        Am_Object::operator=(&local_60,in_obj);
        do {
          Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)&local_60);
          Am_Object::operator=(&local_60,&local_38);
          Am_Object::~Am_Object(&local_38);
          Am_Point_In_Obj(&local_38,(int)&local_60,x,(Am_Object *)(ulong)local_3c);
          Am_Object::operator=(&local_48,&local_38);
          Am_Object::~Am_Object(&local_38);
          bVar2 = Am_Object::Valid(&local_48);
          if (!bVar2) break;
          bVar1 = Am_Object::operator!=(&local_60,ref_obj);
        } while (bVar1);
      }
    }
    else {
      bVar2 = false;
    }
  }
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_60);
  return bVar2;
}

Assistant:

bool
Am_Point_In_All_Owners(const Am_Object &in_obj, int x, int y,
                       const Am_Object &ref_obj)
{
  Am_Object owner, result;
  if (in_obj.Is_Instance_Of(Am_Screen))
    return true;
  if (!in_obj.Is_Part_Of(ref_obj))
    return false;
  // in_obj not actually part of system
  if (in_obj == ref_obj)
    return true;
  owner = in_obj;
  //check all owners all the way up to window
  do {
    owner = owner.Get_Owner();
    //if (!(bool)owner.Get(Am_VISIBLE)) return false;
    // checking visible should be handled in Am_Point_In_Obj
    result = Am_Point_In_Obj(owner, x, y, ref_obj);
    if (!result.Valid())
      return false;
  } while (owner != ref_obj);
  return true; // owner reached top of hierarchy (ref_obj)
}